

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall(Arguments *args)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  Arguments local_30;
  
  local_30.Info = args->Info;
  local_30.Values = args->Values;
  bVar3 = IsConstructorSuperCall(&local_30);
  if (bVar3) {
    return bVar3;
  }
  if (((args->Info).field_0x3 & 1) == 0) {
    return bVar3;
  }
  pvVar6 = Arguments::operator[](args,0);
  if (pvVar6 == (Var)0x0) {
    return bVar3;
  }
  pvVar6 = Arguments::operator[](args,0);
  if (pvVar6 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00aa8bc3;
    *puVar7 = 0;
LAB_00aa8a8e:
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00aa8bc3;
      *puVar7 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        return bVar3;
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00aa8b55;
      }
    }
  }
  else if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)pvVar6 >> 0x32 == 0 && ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00aa8a8e;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00aa8b55:
    bVar4 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar4) goto LAB_00aa8bc3;
    *puVar7 = 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,0x614,
                              "(isCtorSuperCall || !args.IsNewCall() || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)"
                              ,
                              "isCtorSuperCall || !args.IsNewCall() || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch"
                             );
  if (bVar4) {
    *puVar7 = 0;
    return bVar3;
  }
LAB_00aa8bc3:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool JavascriptOperators::GetAndAssertIsConstructorSuperCall(Arguments args)
    {
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);
        Assert(isCtorSuperCall || !args.IsNewCall()
                || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch);
        return isCtorSuperCall;
    }